

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_PC_BrAddInterObjectInconsistencyFail_Test::TestBody
          (InterpreterTestSuite_PC_BrAddInterObjectInconsistencyFail_Test *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  string local_660;
  AssertHelper local_640;
  Message local_638;
  bool local_629;
  undefined1 local_628 [8];
  AssertionResult gtest_ar__2;
  allocator local_5c9;
  string local_5c8;
  Expression local_5a8;
  AssertHelper local_590;
  Message local_588;
  Error local_580;
  allocator local_551;
  string local_550;
  Error local_530;
  undefined1 local_508 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_4d8;
  Message local_4d0;
  bool local_4c1;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar__1;
  allocator local_461;
  string local_460;
  Expression local_440;
  AssertHelper local_428;
  Message local_420;
  Error local_418;
  allocator local_3e9;
  string local_3e8;
  Error local_3c8;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_370;
  Message local_368;
  bool local_359;
  undefined1 local_358 [8];
  AssertionResult gtest_ar_;
  allocator local_2f9;
  string local_2f8;
  Expression local_2d8;
  AssertHelper local_2c0;
  Message local_2b8;
  Error local_2b0;
  allocator local_281;
  string local_280;
  Error local_260;
  undefined1 local_238 [8];
  AssertionResult gtest_ar;
  Value value;
  Expression expr;
  undefined1 local_1c0 [8];
  string brJsonSameXPanDifferentDomains;
  undefined1 local_198 [8];
  string brJsonSameXPanDifferentNwkNames;
  undefined1 local_170 [8];
  string brJsonSameAddr;
  undefined1 local_140 [8];
  TestContext ctx;
  InterpreterTestSuite_PC_BrAddInterObjectInconsistencyFail_Test *this_local;
  
  ctx.mCommissionerAppStaticExpecter.gmock02_Create_150.super_UntypedFunctionMockerBase.
  untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  InterpreterTestSuite::TestContext::TestContext((TestContext *)local_140);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,(TestContext *)local_140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_170,
             "[\n    {\n        \"Addr\": \"1234::5678\",\n        \"Port\": 2000,\n        \"ThreadVersion\": \"th1.2\",\n        \"State\": 0,\n    },\n    {\n        \"Addr\": \"1234::5678\",\n        \"Port\": 2000,\n        \"ThreadVersion\": \"th1.2\",\n        \"State\": 0,\n    }\n]"
             ,(allocator *)(brJsonSameXPanDifferentNwkNames.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(brJsonSameXPanDifferentNwkNames.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_198,
             "[\n    {\n        \"Addr\": \"1234::5678\",\n        \"Port\": 2000,\n        \"ThreadVersion\": \"th1.2\",\n        \"State\": 0,\n        \"NetworkName\": \"net1\",\n        \"ExtendedPanId\": 1234,\n     },\n    {\n        \"Addr\": \"1234::5679\",\n        \"Port\": 2000,\n        \"ThreadVersion\": \"th1.2\",\n        \"State\": 0,\n        \"NetworkName\": \"net2\",\n        \"ExtendedPanId\": 1234,\n    }\n]"
             ,(allocator *)(brJsonSameXPanDifferentDomains.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(brJsonSameXPanDifferentDomains.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_1c0,
             "[\n    {\n        \"Addr\": \"1234::5678\",\n        \"Port\": 2000,\n        \"ThreadVersion\": \"th1.2\",\n        \"State\": 0,\n        \"ExtendedPanId\": 1234,\n        \"NetworkName\": \"net2\",\n        \"DomainName\": \"dom1\"\n    },\n    {\n        \"Addr\": \"1234::5679\",\n        \"Port\": 2000,\n        \"ThreadVersion\": \"th1.2\",\n        \"State\": 0,\n        \"NetworkName\": \"net2\",\n        \"ExtendedPanId\": 1234,\n        \"DomainName\": \"dom2\"\n    }\n]"
             ,(allocator *)
              ((long)&expr.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&expr.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&value.mData.field_2 + 8));
  ot::commissioner::Interpreter::Value::Value((Value *)&gtest_ar.message_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_280,"./tmp/json.json",&local_281);
  ot::commissioner::WriteFile(&local_260,(string *)local_170,&local_280);
  ot::commissioner::Error::Error(&local_2b0);
  testing::internal::EqHelper::Compare<ot::commissioner::Error,_ot::commissioner::Error,_nullptr>
            ((EqHelper *)local_238,"WriteFile(brJsonSameAddr, \"./tmp/json.json\")","Error{}",
             &local_260,&local_2b0);
  ot::commissioner::Error::~Error(&local_2b0);
  ot::commissioner::Error::~Error(&local_260);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar2) {
    testing::Message::Message(&local_2b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x98f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
    testing::internal::AssertHelper::~AssertHelper(&local_2c0);
    testing::Message::~Message(&local_2b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2f8,"br add ./tmp/json.json",&local_2f9);
  ot::commissioner::Interpreter::ParseExpression(&local_2d8,(Interpreter *)local_140,&local_2f8);
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&value.mData.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(pvVar1,&local_2d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2d8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
  ot::commissioner::Interpreter::Eval((Value *)&gtest_ar_.message_,(Interpreter *)local_140,pvVar1);
  ot::commissioner::Interpreter::Value::operator=
            ((Value *)&gtest_ar.message_,(Value *)&gtest_ar_.message_);
  ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar_.message_);
  bVar2 = ot::commissioner::Interpreter::Value::HasNoError((Value *)&gtest_ar.message_);
  local_359 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_358,&local_359,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
  if (!bVar2) {
    testing::Message::Message(&local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_358,(AssertionResult *)0x46a487,
               "true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x992,pcVar3);
    testing::internal::AssertHelper::operator=(&local_370,&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3e8,"./tmp/json.json",&local_3e9);
  ot::commissioner::WriteFile(&local_3c8,(string *)local_198,&local_3e8);
  ot::commissioner::Error::Error(&local_418);
  testing::internal::EqHelper::Compare<ot::commissioner::Error,_ot::commissioner::Error,_nullptr>
            ((EqHelper *)local_3a0,"WriteFile(brJsonSameXPanDifferentNwkNames, \"./tmp/json.json\")"
             ,"Error{}",&local_3c8,&local_418);
  ot::commissioner::Error::~Error(&local_418);
  ot::commissioner::Error::~Error(&local_3c8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
  if (!bVar2) {
    testing::Message::Message(&local_420);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_428,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x994,pcVar3);
    testing::internal::AssertHelper::operator=(&local_428,&local_420);
    testing::internal::AssertHelper::~AssertHelper(&local_428);
    testing::Message::~Message(&local_420);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_460,"br add ./tmp/json.json",&local_461);
  ot::commissioner::Interpreter::ParseExpression(&local_440,(Interpreter *)local_140,&local_460);
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&value.mData.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(pvVar1,&local_440);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_440);
  std::__cxx11::string::~string((string *)&local_460);
  std::allocator<char>::~allocator((allocator<char> *)&local_461);
  ot::commissioner::Interpreter::Eval
            ((Value *)&gtest_ar__1.message_,(Interpreter *)local_140,pvVar1);
  ot::commissioner::Interpreter::Value::operator=
            ((Value *)&gtest_ar.message_,(Value *)&gtest_ar__1.message_);
  ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar__1.message_);
  bVar2 = ot::commissioner::Interpreter::Value::HasNoError((Value *)&gtest_ar.message_);
  local_4c1 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4c0,&local_4c1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar2) {
    testing::Message::Message(&local_4d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_2.message_,(internal *)local_4c0,(AssertionResult *)0x46a487,
               "true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x997,pcVar3);
    testing::internal::AssertHelper::operator=(&local_4d8,&local_4d0);
    testing::internal::AssertHelper::~AssertHelper(&local_4d8);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_4d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_550,"./tmp/json.json",&local_551);
  ot::commissioner::WriteFile(&local_530,(string *)local_1c0,&local_550);
  ot::commissioner::Error::Error(&local_580);
  testing::internal::EqHelper::Compare<ot::commissioner::Error,_ot::commissioner::Error,_nullptr>
            ((EqHelper *)local_508,"WriteFile(brJsonSameXPanDifferentDomains, \"./tmp/json.json\")",
             "Error{}",&local_530,&local_580);
  ot::commissioner::Error::~Error(&local_580);
  ot::commissioner::Error::~Error(&local_530);
  std::__cxx11::string::~string((string *)&local_550);
  std::allocator<char>::~allocator((allocator<char> *)&local_551);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_508);
  if (!bVar2) {
    testing::Message::Message(&local_588);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_508);
    testing::internal::AssertHelper::AssertHelper
              (&local_590,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x999,pcVar3);
    testing::internal::AssertHelper::operator=(&local_590,&local_588);
    testing::internal::AssertHelper::~AssertHelper(&local_590);
    testing::Message::~Message(&local_588);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_508);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5c8,"br add ./tmp/json.json",&local_5c9);
  ot::commissioner::Interpreter::ParseExpression(&local_5a8,(Interpreter *)local_140,&local_5c8);
  pvVar1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&value.mData.field_2 + 8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(pvVar1,&local_5a8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5a8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c9);
  ot::commissioner::Interpreter::Eval
            ((Value *)&gtest_ar__2.message_,(Interpreter *)local_140,pvVar1);
  ot::commissioner::Interpreter::Value::operator=
            ((Value *)&gtest_ar.message_,(Value *)&gtest_ar__2.message_);
  ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar__2.message_);
  bVar2 = ot::commissioner::Interpreter::Value::HasNoError((Value *)&gtest_ar.message_);
  local_629 = (bool)(~bVar2 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_628,&local_629,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_628);
  if (!bVar2) {
    testing::Message::Message(&local_638);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_660,(internal *)local_628,(AssertionResult *)0x46a487,"true","false",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_640,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x99c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_640,&local_638);
    testing::internal::AssertHelper::~AssertHelper(&local_640);
    std::__cxx11::string::~string((string *)&local_660);
    testing::Message::~Message(&local_638);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_628);
  ot::commissioner::Interpreter::Value::~Value((Value *)&gtest_ar.message_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&value.mData.field_2 + 8));
  std::__cxx11::string::~string((string *)local_1c0);
  std::__cxx11::string::~string((string *)local_198);
  std::__cxx11::string::~string((string *)local_170);
  InterpreterTestSuite::TestContext::~TestContext((TestContext *)local_140);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, PC_BrAddInterObjectInconsistencyFail)
{
    TestContext ctx;
    InitContext(ctx);

    std::string brJsonSameAddr                  = "[\n\
    {\n\
        \"Addr\": \"1234::5678\",\n\
        \"Port\": 2000,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
    },\n\
    {\n\
        \"Addr\": \"1234::5678\",\n\
        \"Port\": 2000,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
    }\n\
]";
    std::string brJsonSameXPanDifferentNwkNames = "[\n\
    {\n\
        \"Addr\": \"1234::5678\",\n\
        \"Port\": 2000,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
        \"NetworkName\": \"net1\",\n\
        \"ExtendedPanId\": 1234,\n\
     },\n\
    {\n\
        \"Addr\": \"1234::5679\",\n\
        \"Port\": 2000,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
        \"NetworkName\": \"net2\",\n\
        \"ExtendedPanId\": 1234,\n\
    }\n\
]";
    std::string brJsonSameXPanDifferentDomains  = "[\n\
    {\n\
        \"Addr\": \"1234::5678\",\n\
        \"Port\": 2000,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
        \"ExtendedPanId\": 1234,\n\
        \"NetworkName\": \"net2\",\n\
        \"DomainName\": \"dom1\"\n\
    },\n\
    {\n\
        \"Addr\": \"1234::5679\",\n\
        \"Port\": 2000,\n\
        \"ThreadVersion\": \"th1.2\",\n\
        \"State\": 0,\n\
        \"NetworkName\": \"net2\",\n\
        \"ExtendedPanId\": 1234,\n\
        \"DomainName\": \"dom2\"\n\
    }\n\
]";

    Interpreter::Expression expr;
    Interpreter::Value      value;

    EXPECT_EQ(WriteFile(brJsonSameAddr, "./tmp/json.json"), Error{});
    expr  = ctx.mInterpreter.ParseExpression("br add ./tmp/json.json");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_FALSE(value.HasNoError());

    EXPECT_EQ(WriteFile(brJsonSameXPanDifferentNwkNames, "./tmp/json.json"), Error{});
    expr  = ctx.mInterpreter.ParseExpression("br add ./tmp/json.json");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_FALSE(value.HasNoError());

    EXPECT_EQ(WriteFile(brJsonSameXPanDifferentDomains, "./tmp/json.json"), Error{});
    expr  = ctx.mInterpreter.ParseExpression("br add ./tmp/json.json");
    value = ctx.mInterpreter.Eval(expr);
    EXPECT_FALSE(value.HasNoError());
}